

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O1

bool __thiscall spvtools::opt::IRContext::IsConsistent(IRContext *this)

{
  Module *pMVar1;
  pointer puVar2;
  tuple<spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_> tVar3;
  __uniq_ptr_data<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>,_true,_true>
  _Var4;
  long *plVar5;
  BasicBlock *pBVar6;
  DecorationManager *lhs;
  bool bVar7;
  bool bVar8;
  char cVar9;
  uint32_t uVar10;
  mapped_type *ppFVar11;
  BasicBlock *pBVar12;
  pointer puVar13;
  Instruction *pIVar14;
  long *plVar15;
  Instruction *pIVar16;
  bool bVar17;
  DefUseManager new_def_use;
  Instruction *local_e0;
  undefined1 local_d8 [56];
  Module *local_a0;
  _Rb_tree_color _Stack_98;
  undefined4 uStack_94;
  uint32_t local_90;
  uint32_t uStack_8c;
  uint32_t uStack_88;
  _Hashtable<const_spvtools::opt::Instruction_*,_std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_70;
  
  if ((this->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
    analysis::DefUseManager::DefUseManager
              ((DefUseManager *)local_d8,
               (this->module_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
               .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
    if ((this->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      BuildDefUseManager(this);
    }
    bVar8 = analysis::CompareAndPrintDifferences
                      ((this->def_use_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                       _M_head_impl,(DefUseManager *)local_d8);
    std::
    _Hashtable<const_spvtools::opt::Instruction_*,_std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_70);
    std::
    _Rb_tree<spvtools::opt::analysis::UserEntry,_spvtools::opt::analysis::UserEntry,_std::_Identity<spvtools::opt::analysis::UserEntry>,_spvtools::opt::analysis::UserEntryLess,_std::allocator<spvtools::opt::analysis::UserEntry>_>
    ::_M_erase((_Rb_tree<spvtools::opt::analysis::UserEntry,_spvtools::opt::analysis::UserEntry,_std::_Identity<spvtools::opt::analysis::UserEntry>,_spvtools::opt::analysis::UserEntryLess,_std::allocator<spvtools::opt::analysis::UserEntry>_>
                *)&local_a0,(_Link_type)CONCAT44(uStack_8c,local_90));
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_d8);
    if (!bVar8) {
      return false;
    }
  }
  if ((this->valid_analyses_ & kAnalysisIdToFuncMapping) != kAnalysisNone) {
    pMVar1 = (this->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    puVar13 = *(pointer *)
               &(pMVar1->functions_).
                super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                ._M_impl;
    puVar2 = *(pointer *)
              ((long)&(pMVar1->functions_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
              + 8);
    if (puVar13 != puVar2) {
      bVar8 = false;
      do {
        tVar3.
        super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
        .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl =
             *(_Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
               *)&(puVar13->_M_t).
                  super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
        ;
        pIVar14 = *(Instruction **)
                   tVar3.
                   super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                   .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl;
        uVar10 = 0;
        if (pIVar14->has_result_id_ == true) {
          uVar10 = Instruction::GetSingleWordOperand(pIVar14,(uint)pIVar14->has_type_id_);
        }
        local_d8._0_4_ = uVar10;
        ppFVar11 = std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Function_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Function_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&this->id_to_func_,(key_type *)local_d8);
        if ((_Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
             )*ppFVar11 !=
            (_Head_base<0UL,_spvtools::opt::Function_*,_false>)
            tVar3.
            super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
            .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl) {
          if (!bVar8) {
            return false;
          }
          break;
        }
        puVar13 = puVar13 + 1;
        bVar8 = puVar13 == puVar2;
      } while (!bVar8);
    }
  }
  if ((this->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
    pMVar1 = (this->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    puVar13 = *(pointer *)
               &(pMVar1->functions_).
                super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                ._M_impl;
    puVar2 = *(pointer *)
              ((long)&(pMVar1->functions_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
              + 8);
    if (puVar13 != puVar2) {
      bVar8 = false;
      do {
        _Var4.
        super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
        .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl =
             (puVar13->_M_t).
             super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
        ;
        plVar5 = *(long **)((long)_Var4.
                                  super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                                  .super__Head_base<0UL,_spvtools::opt::Function_*,_false>.
                                  _M_head_impl + 0xa0);
        for (plVar15 = *(long **)((long)_Var4.
                                        super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                                        .super__Head_base<0UL,_spvtools::opt::Function_*,_false>.
                                        _M_head_impl + 0x98); bVar7 = plVar15 != plVar5, bVar7;
            plVar15 = plVar15 + 1) {
          pBVar6 = (BasicBlock *)*plVar15;
          local_d8._24_8_ =
               std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/ir_context.cpp:394:34)>
               ::_M_invoke;
          local_d8._16_8_ =
               std::
               _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/ir_context.cpp:394:34)>
               ::_M_manager;
          pIVar14 = (pBVar6->label_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
          local_d8._0_8_ = this;
          local_d8._8_8_ = pBVar6;
          if ((pIVar14 == (Instruction *)0x0) ||
             (pBVar12 = get_instr_block(this,pIVar14), pBVar12 == (BasicBlock *)local_d8._8_8_)) {
            pIVar14 = (pBVar6->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                      super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
            bVar17 = true;
            if ((pIVar14 != (Instruction *)0x0) &&
               ((pIVar14->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false
               )) {
              do {
                bVar17 = pIVar14 == (Instruction *)0x0;
                if (bVar17) break;
                pIVar16 = (pIVar14->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
                local_e0 = pIVar14;
                if ((_Hash_node_base *)local_d8._16_8_ == (_Hash_node_base *)0x0) {
                  std::__throw_bad_function_call();
                }
                bVar17 = false;
                if ((pIVar16->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ !=
                    false) {
                  pIVar16 = (Instruction *)0x0;
                }
                cVar9 = (*(code *)local_d8._24_8_)(local_d8,&local_e0);
                pIVar14 = pIVar16;
              } while (cVar9 != '\0');
            }
          }
          else {
            bVar17 = false;
          }
          if ((_Hash_node_base *)local_d8._16_8_ != (_Hash_node_base *)0x0) {
            (*(code *)local_d8._16_8_)(local_d8,local_d8,3);
          }
          if (!bVar17) {
            if (bVar7) {
              if (!bVar8) {
                return false;
              }
              goto LAB_0023a880;
            }
            break;
          }
        }
        puVar13 = puVar13 + 1;
        bVar8 = puVar13 == puVar2;
      } while (!bVar8);
    }
  }
LAB_0023a880:
  bVar8 = CheckCFG(this);
  if (!bVar8) {
    return false;
  }
  if ((this->valid_analyses_ & kAnalysisDecorations) != kAnalysisNone) {
    lhs = (this->decoration_mgr_)._M_t.
          super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
          .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>._M_head_impl;
    local_a0 = (this->module_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
               .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    local_d8._0_8_ = local_d8 + 0x30;
    local_d8._8_8_ = (pointer)0x1;
    local_d8._16_8_ = (_Hash_node_base *)0x0;
    local_d8._24_8_ = (pointer)0x0;
    local_d8._32_4_ = 1.0;
    local_d8._40_8_ = (pointer)0x0;
    local_d8._48_8_ = (pointer)0x0;
    analysis::DecorationManager::AnalyzeDecorations((DecorationManager *)local_d8);
    bVar8 = analysis::operator==(lhs,(DecorationManager *)local_d8);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_d8);
    if (!bVar8) {
      return false;
    }
  }
  if ((this->feature_mgr_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
      .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl !=
      (FeatureManager *)0x0) {
    local_d8._0_8_ = &this->grammar_;
    local_d8._8_8_ = (pointer)0x0;
    local_d8._16_8_ = (_Hash_node_base *)0x0;
    local_d8._24_8_ = (pointer)0x0;
    local_d8._32_8_ = 0;
    local_d8._40_8_ = (pointer)0x0;
    local_d8._48_8_ = (pointer)0x0;
    local_a0 = (Module *)0x0;
    _Stack_98 = _S_red;
    uStack_94 = 0;
    local_90 = 0;
    uStack_8c = 0;
    uStack_88 = 0;
    FeatureManager::Analyze
              ((FeatureManager *)local_d8,
               (this->module_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
               .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
    bVar8 = operator==((FeatureManager *)local_d8,
                       (this->feature_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::FeatureManager_*,_std::default_delete<spvtools::opt::FeatureManager>_>
                       .super__Head_base<0UL,_spvtools::opt::FeatureManager_*,_false>._M_head_impl);
    if ((pointer)local_d8._40_8_ != (pointer)0x0) {
      operator_delete((void *)local_d8._40_8_,(long)local_a0 - local_d8._40_8_);
    }
    if ((pointer)local_d8._8_8_ != (pointer)0x0) {
      operator_delete((void *)local_d8._8_8_,local_d8._24_8_ - local_d8._8_8_);
    }
    if (!bVar8) {
      return false;
    }
  }
  return true;
}

Assistant:

bool IRContext::IsConsistent() {
#ifndef SPIRV_CHECK_CONTEXT
  return true;
#else
  if (AreAnalysesValid(kAnalysisDefUse)) {
    analysis::DefUseManager new_def_use(module());
    if (!CompareAndPrintDifferences(*get_def_use_mgr(), new_def_use)) {
      return false;
    }
  }

  if (AreAnalysesValid(kAnalysisIdToFuncMapping)) {
    for (auto& fn : *module_) {
      if (id_to_func_[fn.result_id()] != &fn) {
        return false;
      }
    }
  }

  if (AreAnalysesValid(kAnalysisInstrToBlockMapping)) {
    for (auto& func : *module()) {
      for (auto& block : func) {
        if (!block.WhileEachInst([this, &block](Instruction* inst) {
              if (get_instr_block(inst) != &block) {
                return false;
              }
              return true;
            }))
          return false;
      }
    }
  }

  if (!CheckCFG()) {
    return false;
  }

  if (AreAnalysesValid(kAnalysisDecorations)) {
    analysis::DecorationManager* dec_mgr = get_decoration_mgr();
    analysis::DecorationManager current(module());

    if (*dec_mgr != current) {
      return false;
    }
  }

  if (feature_mgr_ != nullptr) {
    FeatureManager current(grammar_);
    current.Analyze(module());

    if (current != *feature_mgr_) {
      return false;
    }
  }
  return true;
#endif
}